

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  ThreadSafeArena *pTVar1;
  Message *this_00;
  Nonnull<const_char_*> pcVar2;
  ThreadSafeArena *pTVar3;
  ThreadSafeArena *pTVar4;
  ThreadSafeArena *unaff_R13;
  
  if (sub_message == (Message *)0x0) {
    sub_message = (Message *)0x0;
    goto LAB_0042794a;
  }
  pTVar1 = (ThreadSafeArena *)(sub_message->super_MessageLite)._internal_metadata_.ptr_;
  pTVar3 = pTVar1;
  if (((ulong)pTVar1 & 1) != 0) {
    pTVar3 = *(ThreadSafeArena **)((ulong)pTVar1 & 0xfffffffffffffffe);
  }
  if (pTVar3 == (ThreadSafeArena *)0x0) {
LAB_004278c9:
    unaff_R13 = (ThreadSafeArena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)unaff_R13 & 1) != 0) {
      unaff_R13 = *(ThreadSafeArena **)((ulong)unaff_R13 & 0xfffffffffffffffe);
    }
    if (((ulong)pTVar1 & 1) != 0) {
      pTVar1 = *(ThreadSafeArena **)((ulong)pTVar1 & 0xfffffffffffffffe);
    }
    if (unaff_R13 == pTVar1) goto LAB_0042794a;
    if (pTVar1 != (ThreadSafeArena *)0x0) {
      this_00 = MutableMessage(this,message,field,(MessageFactory *)0x0);
      Message::CopyFrom(this_00,sub_message);
      return;
    }
    if (unaff_R13 == (ThreadSafeArena *)0x0) goto LAB_004279a4;
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pTVar3 = pTVar1;
    if (((ulong)pTVar1 & 1) != 0) {
      pTVar3 = *(ThreadSafeArena **)((ulong)pTVar1 & 0xfffffffffffffffe);
    }
    pTVar4 = (ThreadSafeArena *)(message->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)pTVar4 & 1) != 0) {
      pTVar4 = *(ThreadSafeArena **)((ulong)pTVar4 & 0xfffffffffffffffe);
    }
    if (pTVar3 == pTVar4) goto LAB_004278c9;
    SetAllocatedMessage();
LAB_004279a4:
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       ((void *)0x0,(void *)0x0,"arena != nullptr");
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    SetAllocatedMessage();
  }
  internal::ThreadSafeArena::AddCleanup
            (unaff_R13,sub_message,internal::arena_delete_object<google::protobuf::MessageLite>);
LAB_0042794a:
  UnsafeArenaSetAllocatedMessage(this,message,sub_message,field);
  return;
}

Assistant:

void Reflection::SetAllocatedMessage(Message* message, Message* sub_message,
                                     const FieldDescriptor* field) const {
  ABSL_DCHECK(sub_message == nullptr || sub_message->GetArena() == nullptr ||
              sub_message->GetArena() == message->GetArena());

  if (sub_message == nullptr) {
    UnsafeArenaSetAllocatedMessage(message, nullptr, field);
    return;
  }

  Arena* arena = message->GetArena();
  Arena* sub_arena = sub_message->GetArena();
  if (arena == sub_arena) {
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
    return;
  }

  // If message and sub-message are in different memory ownership domains
  // (different arenas, or one is on heap and one is not), then we may need to
  // do a copy.
  if (sub_arena == nullptr) {
    ABSL_DCHECK_NE(arena, nullptr);
    // Case 1: parent is on an arena and child is heap-allocated. We can add
    // the child to the arena's Own() list to free on arena destruction, then
    // set our pointer.
    arena->Own(sub_message);
    UnsafeArenaSetAllocatedMessage(message, sub_message, field);
  } else {
    // Case 2: all other cases. We need to make a copy. MutableMessage() will
    // either get the existing message object, or instantiate a new one as
    // appropriate w.r.t. our arena.
    Message* sub_message_copy = MutableMessage(message, field);
    sub_message_copy->CopyFrom(*sub_message);
  }
}